

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

optional<sub_bound_token> *
read_right_bound_token
          (optional<sub_bound_token> *__return_storage_ptr__,string_view buf_1,string_view buf_2,
          string_view buf_3,string_view buf_4)

{
  char cVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  int iVar4;
  char *pcVar5;
  size_type __rlen;
  _Storage<double,_true> _Var6;
  undefined1 auVar7 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  optional<operator_token> oVar11;
  optional<double> oVar12;
  undefined1 auVar10 [56];
  
  auVar10 = in_ZMM0._8_56_;
  pcVar5 = buf_2._M_str;
  oVar11 = read_operator(buf_1,buf_2);
  if (((undefined1  [12])
       oVar11.super__Optional_base<operator_token,_true,_true>._M_payload.
       super__Optional_payload_base<operator_token> & (undefined1  [12])0x1) !=
      (undefined1  [12])0x0) {
    if (oVar11.super__Optional_base<operator_token,_true,_true>._M_payload.
        super__Optional_payload_base<operator_token>._M_payload._4_4_ == 1) {
      if ((buf_2._M_len == 1) && ((*pcVar5 == '+' || (*pcVar5 == '-')))) {
        cVar1 = *pcVar5;
        oVar12 = read_real(buf_3);
        auVar8._0_8_ = oVar12.super__Optional_base<double,_true,_true>._M_payload.
                       super__Optional_payload_base<double>._M_payload;
        auVar8._8_56_ = auVar10;
        if (((undefined1  [16])
             oVar12.super__Optional_base<double,_true,_true>._M_payload.
             super__Optional_payload_base<double> & (undefined1  [16])0x1) == (undefined1  [16])0x0)
        goto LAB_0012c15c;
        auVar2._8_8_ = 0x8000000000000000;
        auVar2._0_8_ = 0x8000000000000000;
        auVar7 = vxorpd_avx512vl(auVar8._0_16_,auVar2);
        _Var6 = (_Storage<double,_true>)
                ((ulong)(cVar1 == '-') * auVar7._0_8_ + (ulong)(cVar1 != '-') * (long)auVar8._0_8_);
LAB_0012c148:
        iVar4 = 3;
      }
      else {
        oVar12 = read_real(buf_2);
        _Var6 = oVar12.super__Optional_base<double,_true,_true>._M_payload.
                super__Optional_payload_base<double>._M_payload;
        if (((undefined1  [16])
             oVar12.super__Optional_base<double,_true,_true>._M_payload.
             super__Optional_payload_base<double> & (undefined1  [16])0x1) == (undefined1  [16])0x0)
        goto LAB_0012c15c;
        iVar4 = 2;
      }
LAB_0012c14d:
      (__return_storage_ptr__->super__Optional_base<sub_bound_token,_true,_true>)._M_payload.
      super__Optional_payload_base<sub_bound_token>._M_payload._M_value.value = (double)_Var6;
      (__return_storage_ptr__->super__Optional_base<sub_bound_token,_true,_true>)._M_payload.
      super__Optional_payload_base<sub_bound_token>._M_payload._M_value.read = iVar4;
      bVar3 = true;
      (__return_storage_ptr__->super__Optional_base<sub_bound_token,_true,_true>)._M_payload.
      super__Optional_payload_base<sub_bound_token>._M_payload._M_value.op =
           oVar11.super__Optional_base<operator_token,_true,_true>._M_payload.
           super__Optional_payload_base<operator_token>._M_payload._0_4_;
      goto LAB_0012c15e;
    }
    if ((buf_3._M_len == 1) && ((*buf_3._M_str == '+' || (*buf_3._M_str == '-')))) {
      cVar1 = *buf_3._M_str;
      oVar12 = read_real(buf_4);
      auVar9._0_8_ = oVar12.super__Optional_base<double,_true,_true>._M_payload.
                     super__Optional_payload_base<double>._M_payload;
      auVar9._8_56_ = auVar10;
      if (((undefined1  [16])
           oVar12.super__Optional_base<double,_true,_true>._M_payload.
           super__Optional_payload_base<double> & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        auVar7._8_8_ = 0x8000000000000000;
        auVar7._0_8_ = 0x8000000000000000;
        auVar7 = vxorpd_avx512vl(auVar9._0_16_,auVar7);
        iVar4 = 4;
        _Var6 = (_Storage<double,_true>)
                ((ulong)(cVar1 == '-') * auVar7._0_8_ + (ulong)(cVar1 != '-') * (long)auVar9._0_8_);
        goto LAB_0012c14d;
      }
    }
    else {
      oVar12 = read_real(buf_3);
      _Var6 = oVar12.super__Optional_base<double,_true,_true>._M_payload.
              super__Optional_payload_base<double>._M_payload;
      if (((undefined1  [16])
           oVar12.super__Optional_base<double,_true,_true>._M_payload.
           super__Optional_payload_base<double> & (undefined1  [16])0x1) != (undefined1  [16])0x0)
      goto LAB_0012c148;
    }
  }
LAB_0012c15c:
  bVar3 = false;
LAB_0012c15e:
  (__return_storage_ptr__->super__Optional_base<sub_bound_token,_true,_true>)._M_payload.
  super__Optional_payload_base<sub_bound_token>._M_engaged = bVar3;
  return __return_storage_ptr__;
}

Assistant:

std::optional<sub_bound_token>
read_right_bound_token(const std::string_view buf_1,
                       const std::string_view buf_2,
                       const std::string_view buf_3,
                       const std::string_view buf_4) noexcept
{
    double negative = 1.0;
    baryonyx::operator_type op = baryonyx::operator_type::equal;

    if (auto operator_token = read_operator(buf_1, buf_2); operator_token) {
        op = operator_token->op;
        if (operator_token->read == 1) {
            if (buf_2 == "+" || buf_2 == "-") {
                if (buf_2 == "-")
                    negative = -1.0;

                if (auto value_opt = read_real(buf_3); value_opt)
                    return sub_bound_token(negative * *value_opt, 3, op);
                else
                    return std::nullopt;
            } else {
                if (auto value_opt = read_real(buf_2); value_opt)
                    return sub_bound_token(negative * *value_opt, 2, op);
                else
                    return std::nullopt;
            }
        } else {
            if (buf_3 == "+" || buf_3 == "-") {
                if (buf_3 == "-")
                    negative = -1.0;

                if (auto value_opt = read_real(buf_4); value_opt)
                    return sub_bound_token(negative * *value_opt, 4, op);
                else
                    return std::nullopt;
            } else {
                if (auto value_opt = read_real(buf_3); value_opt)
                    return sub_bound_token(negative * *value_opt, 3, op);
                else
                    return std::nullopt;
            }
        }
    } else
        return std::nullopt;
}